

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqualityProxyMono.cpp
# Opt level: O1

Clause * __thiscall
Shell::EqualityProxyMono::createEqProxyAxiom(EqualityProxyMono *this,LiteralStack *literalStack)

{
  uint64_t uVar1;
  Unit *pUVar2;
  bool bVar3;
  Entry *pEVar4;
  Entry *pEVar5;
  UnitList *pUVar6;
  Clause *pCVar7;
  Literal **ppLVar8;
  UnitList *pUVar9;
  DHSet<Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> sorts;
  NonspecificInferenceMany local_98;
  DHMap<Kernel::TermList,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2> local_88;
  Inference local_60;
  
  local_88._timestamp = 1;
  local_88._size = 0;
  local_88._deleted = 0;
  local_88._capacityIndex = 0;
  local_88._capacity = 0;
  local_88._20_8_ = 0;
  local_88._28_8_ = 0;
  local_88._afterLast._4_4_ = 0;
  ppLVar8 = literalStack->_cursor;
  if (ppLVar8 == literalStack->_stack) {
    pUVar9 = (UnitList *)0x0;
  }
  else {
    pUVar9 = (UnitList *)0x0;
    do {
      local_98._0_4_ = (ppLVar8[-1]->super_Term)._functor;
      pEVar4 = ::Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::
               findEntry(&s_proxyPredicateSorts,(uint *)&local_98);
      if (pEVar4 != (Entry *)0x0) {
        uVar1 = (pEVar4->_val)._content;
        bVar3 = ::Lib::
                DHMap<Kernel::TermList,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::
                insert(&local_88,uVar1);
        if (bVar3) {
          local_98._0_8_ = uVar1;
          pEVar5 = ::Lib::
                   DHMap<Kernel::TermList,_Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>::
                   findEntry(&s_proxyPremises,(TermList *)&local_98);
          pUVar2 = pEVar5->_val;
          pUVar6 = (UnitList *)
                   ::Lib::FixedSizeAllocator<16UL>::alloc
                             ((FixedSizeAllocator<16UL> *)
                              (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
          pUVar6->_head = pUVar2;
          pUVar6->_tail = pUVar9;
          pUVar9 = pUVar6;
        }
      }
      ppLVar8 = ppLVar8 + -1;
    } while (ppLVar8 != literalStack->_stack);
  }
  local_98.rule = EQUALITY_PROXY_AXIOM2;
  local_98.premises = pUVar9;
  Kernel::Inference::Inference(&local_60,&local_98);
  pCVar7 = Kernel::Clause::fromStack(literalStack,&local_60);
  ::Lib::DHMap<Kernel::TermList,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
            (&local_88);
  return pCVar7;
}

Assistant:

Clause* EqualityProxyMono::createEqProxyAxiom(const LiteralStack& literalStack)
{
  DHSet<TermList> sorts;
  UnitList* prems = 0;

  LiteralStack::ConstIterator it(literalStack);
  while (it.hasNext()) {
    Literal* l = it.next();
    TermList srt;
    if (!s_proxyPredicateSorts.find(l->functor(),srt)) {
      continue;
    }
    if (!sorts.insert(srt)) {
      continue;
    }
    Unit* prem = s_proxyPremises.get(srt);
    ASS(prem);
    UnitList::push(prem, prems);
  }
  ASS(prems);
  Clause* res = Clause::fromStack(literalStack,NonspecificInferenceMany(InferenceRule::EQUALITY_PROXY_AXIOM2,prems));
  return res;
}